

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  undefined4 uVar1;
  ostream *poVar2;
  char local_25;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_25,1);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 7;
  poVar2 = std::ostream::_M_insert<double>((double)P->mu_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_24,1);
  poVar2 = std::ostream::_M_insert<double>((double)P->sigma_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_23,1);
  poVar2 = std::ostream::_M_insert<double>((double)P->a_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_22,1);
  poVar2 = std::ostream::_M_insert<double>((double)P->b_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_21,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<float_t>::digits10 + 1) << P.mu()
            << ' ' << P.sigma() << ' ' << P.a() << ' ' << P.b() << ')';
        out.flags(flags);
        return out;
      }